

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_ASCII85Decoder.hh
# Opt level: O0

void __thiscall Pl_ASCII85Decoder::~Pl_ASCII85Decoder(Pl_ASCII85Decoder *this)

{
  Pl_ASCII85Decoder *this_local;
  
  ~Pl_ASCII85Decoder(this);
  operator_delete(this,0x50);
  return;
}

Assistant:

~Pl_ASCII85Decoder() final = default;